

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t run_container_read(int32_t cardinality,run_container_t *container,char *buf)

{
  uint min;
  
  *(undefined2 *)&container->n_runs = *(undefined2 *)buf;
  min = container->n_runs;
  if (container->capacity < (int)min) {
    run_container_grow(container,min,false);
    min = container->n_runs;
  }
  if (0 < (int)min) {
    memcpy(container->runs,buf + 2,(ulong)min << 2);
    min = container->n_runs;
  }
  return min * 4 + 2;
}

Assistant:

int32_t run_container_read(int32_t cardinality, run_container_t *container,
                           const char *buf) {
    (void)cardinality;
    memcpy(&container->n_runs, buf, sizeof(uint16_t));
    if (container->n_runs > container->capacity)
        run_container_grow(container, container->n_runs, false);
    if(container->n_runs > 0) {
      memcpy(container->runs, buf + sizeof(uint16_t),
           container->n_runs * sizeof(rle16_t));
    }
    return run_container_size_in_bytes(container);
}